

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v8::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  undefined4 in_register_0000003c;
  ulong uVar12;
  char *__s;
  char format [7];
  char local_57 [7];
  long local_50;
  double local_48;
  undefined8 local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_0000003c,precision);
  local_48 = value;
  if (buf->capacity_ <= buf->size_) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,0x974,"empty buffer");
  }
  local_38 = (ulong)specs >> 0x20;
  uVar5 = 5;
  if (-1 < precision) {
    uVar5 = precision - 1;
  }
  bVar8 = specs._4_1_;
  uVar10 = (ulong)uVar5;
  if (1 < bVar8) {
    uVar10 = (ulong)(uint)precision;
  }
  local_57[0] = '%';
  if (bVar8 == 3 && (specs._4_4_ >> 0x14 & 1) != 0) {
    pbVar6 = (byte *)(local_57 + 2);
    local_57[1] = 0x23;
  }
  else {
    pbVar6 = (byte *)(local_57 + 1);
  }
  if (-1 < (int)uVar10) {
    pbVar6[0] = 0x2e;
    pbVar6[1] = 0x2a;
    pbVar6 = pbVar6 + 2;
  }
  if (bVar8 == 3) {
    bVar8 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar8 = (bVar8 == 2) + 0x65;
  }
  *pbVar6 = bVar8;
  pbVar6[1] = 0;
  sVar3 = buf->size_;
  local_50 = sVar3 + 1;
LAB_0011021c:
  while( true ) {
    __s = buf->ptr_ + sVar3;
    uVar9 = buf->capacity_ - sVar3;
    if ((int)uVar10 < 0) {
      uVar5 = snprintf(__s,uVar9,local_57,local_48);
    }
    else {
      uVar5 = snprintf(__s,uVar9,local_57,local_48,uVar10);
    }
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 0) goto LAB_00110283;
    if (uVar12 < uVar9) break;
    uVar12 = local_50 + uVar12;
    if (buf->capacity_ < uVar12) goto LAB_00110291;
  }
  if ((char)local_38 == '\x02') {
    if ((int)local_40 != 0) {
      uVar10 = 1;
      do {
        lVar7 = uVar10 + (uVar12 - 2);
        uVar10 = uVar10 - 1;
      } while ((byte)(__s[lVar7] - 0x30U) < 10);
      if (0 < (int)uVar10) {
LAB_00110486:
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                    ,0x195,"negative value");
      }
      memmove(__s + uVar10 + uVar12 + -1,__s + uVar10 + uVar12,(ulong)(-(int)uVar10 & 0x7fffffff));
      uVar12 = (ulong)(uVar5 - 1);
      uVar9 = buf->capacity_;
      if (uVar9 < uVar12) {
        (**buf->_vptr_buffer)(buf,uVar12);
        uVar9 = buf->capacity_;
      }
      if (uVar9 < uVar12) {
        uVar12 = uVar9;
      }
      buf->size_ = uVar12;
      goto LAB_00110444;
    }
    uVar10 = buf->capacity_;
    if (uVar10 < uVar12) {
      (**buf->_vptr_buffer)(buf,uVar12);
      uVar10 = buf->capacity_;
    }
    if (uVar12 <= uVar10) {
      uVar10 = uVar12;
    }
    buf->size_ = uVar10;
  }
  else {
    if (((uint)local_38 & 0xff) != 3) {
      lVar7 = -2;
      uVar10 = uVar12 - 1;
      do {
        uVar9 = uVar10;
        lVar7 = lVar7 + 1;
        uVar10 = uVar9 - 1;
      } while (__s[uVar9] != 'e');
      cVar2 = __s[uVar9 + 1];
      if ((cVar2 != '+') && (cVar2 != '-')) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                    ,0x9c2,"");
      }
      lVar7 = -lVar7;
      iVar11 = 0;
      do {
        if (9 < (byte)(__s[lVar7 + uVar12] - 0x30U)) {
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                      ,0x9c6,"");
        }
        iVar11 = (uint)(byte)__s[lVar7 + uVar12] + iVar11 * 10 + -0x30;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0);
      iVar4 = -iVar11;
      if (cVar2 != '-') {
        iVar4 = iVar11;
      }
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        do {
          pcVar1 = __s + uVar10;
          uVar10 = uVar10 - 1;
        } while (*pcVar1 == '0');
        if ((int)(uint)uVar10 < 0) goto LAB_00110486;
        memmove(__s + 1,__s + 2,(ulong)((uint)uVar10 & 0x7fffffff));
      }
      uVar12 = local_50 + (uVar10 & 0xffffffff);
      uVar9 = buf->capacity_;
      if (uVar9 < uVar12) {
        (**buf->_vptr_buffer)(buf,uVar12);
        uVar9 = buf->capacity_;
      }
      if (uVar9 < uVar12) {
        uVar12 = uVar9;
      }
      buf->size_ = uVar12;
      uVar10 = (ulong)(uint)(iVar4 - (int)uVar10);
      goto LAB_00110444;
    }
    uVar12 = sVar3 + uVar12;
    uVar10 = buf->capacity_;
    if (uVar10 < uVar12) {
      (**buf->_vptr_buffer)(buf,uVar12);
      uVar10 = buf->capacity_;
    }
    if (uVar10 < uVar12) {
      uVar12 = uVar10;
    }
    buf->size_ = uVar12;
  }
  uVar10 = 0;
LAB_00110444:
  return (int)uVar10;
LAB_00110283:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar12 = buf->capacity_ + 1;
LAB_00110291:
    (**buf->_vptr_buffer)(buf,uVar12);
  }
  goto LAB_0011021c;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    FMT_ASSERT(sign == '+' || sign == '-', "");
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      FMT_ASSERT(is_digit(*p), "");
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}